

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_Done(FT_Library library,FT_Outline *outline)

{
  FT_Memory pFVar1;
  FT_Error FVar2;
  
  if (library != (FT_Library)0x0) {
    if (outline == (FT_Outline *)0x0) {
      FVar2 = 0x14;
    }
    else {
      pFVar1 = library->memory;
      if (pFVar1 == (FT_Memory)0x0) {
        FVar2 = 6;
      }
      else {
        if ((outline->flags & 1) != 0) {
          if (outline->points != (FT_Vector *)0x0) {
            (*pFVar1->free)(pFVar1,outline->points);
          }
          outline->points = (FT_Vector *)0x0;
          if (outline->tags != (char *)0x0) {
            (*pFVar1->free)(pFVar1,outline->tags);
          }
          outline->tags = (char *)0x0;
          if (outline->contours != (short *)0x0) {
            (*pFVar1->free)(pFVar1,outline->contours);
          }
          outline->contours = (short *)0x0;
        }
        outline->tags = (char *)0x0;
        outline->contours = (short *)0x0;
        outline->n_contours = 0;
        outline->n_points = 0;
        *(undefined4 *)&outline->field_0x4 = 0;
        outline->points = (FT_Vector *)0x0;
        *(undefined8 *)&outline->flags = 0;
        FVar2 = 0;
      }
    }
    return FVar2;
  }
  return 0x21;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Done( FT_Library   library,
                   FT_Outline*  outline )
  {
    FT_Memory  memory;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    memory = library->memory;

    if ( !memory )
      return FT_THROW( Invalid_Argument );

    if ( outline->flags & FT_OUTLINE_OWNER )
    {
      FT_FREE( outline->points   );
      FT_FREE( outline->tags     );
      FT_FREE( outline->contours );
    }
    *outline = null_outline;

    return FT_Err_Ok;
  }